

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaResolveElementReferences(xmlSchemaElementPtr elemDecl,xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaElementPtr elemDecl_00;
  xmlSchemaTypePtr pxVar1;
  char *unaff_RBX;
  
  if ((elemDecl != (xmlSchemaElementPtr)0x0) && (((uint)elemDecl->flags >> 8 & 1) == 0)) {
    elemDecl->flags = elemDecl->flags | 0x100;
    if ((elemDecl->subtypes == (xmlSchemaTypePtr)0x0) && (elemDecl->namedType != (xmlChar *)0x0)) {
      pxVar1 = xmlSchemaGetType(ctxt->schema,elemDecl->namedType,elemDecl->namedTypeNs);
      if (pxVar1 == (xmlSchemaTypePtr)0x0) {
        xmlSchemaPResCompAttrErr
                  (ctxt,(xmlParserErrors)elemDecl,(xmlSchemaBasicItemPtr)elemDecl->node,
                   (xmlNodePtr)0x1e3ec0,(char *)elemDecl->namedType,elemDecl->namedTypeNs,
                   &DAT_00000001,0x1e635e,unaff_RBX);
      }
      else {
        elemDecl->subtypes = pxVar1;
      }
    }
    if (elemDecl->substGroup != (xmlChar *)0x0) {
      elemDecl_00 = xmlSchemaGetElem(ctxt->schema,elemDecl->substGroup,elemDecl->substGroupNs);
      if (elemDecl_00 == (xmlSchemaElementPtr)0x0) {
        xmlSchemaPResCompAttrErr
                  (ctxt,(xmlParserErrors)elemDecl,(xmlSchemaBasicItemPtr)0x0,
                   (xmlNodePtr)"substitutionGroup",(char *)elemDecl->substGroup,
                   elemDecl->substGroupNs,(xmlChar *)0xe,0,unaff_RBX);
      }
      else {
        xmlSchemaResolveElementReferences(elemDecl_00,ctxt);
        elemDecl->refDecl = elemDecl_00;
        if (elemDecl->subtypes == (xmlSchemaTypePtr)0x0) {
          pxVar1 = elemDecl_00->subtypes;
          if (pxVar1 == (xmlSchemaTypePtr)0x0) {
            pxVar1 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
          }
          elemDecl->subtypes = pxVar1;
        }
      }
    }
    if (((elemDecl->subtypes == (xmlSchemaTypePtr)0x0) && (elemDecl->namedType == (xmlChar *)0x0))
       && (elemDecl->substGroup == (xmlChar *)0x0)) {
      pxVar1 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
      elemDecl->subtypes = pxVar1;
    }
  }
  return;
}

Assistant:

static void
xmlSchemaResolveElementReferences(xmlSchemaElementPtr elemDecl,
				  xmlSchemaParserCtxtPtr ctxt)
{
    if ((ctxt == NULL) || (elemDecl == NULL) ||
	((elemDecl != NULL) &&
	(elemDecl->flags & XML_SCHEMAS_ELEM_INTERNAL_RESOLVED)))
        return;
    elemDecl->flags |= XML_SCHEMAS_ELEM_INTERNAL_RESOLVED;

    if ((elemDecl->subtypes == NULL) && (elemDecl->namedType != NULL)) {
	xmlSchemaTypePtr type;

	/* (type definition) ... otherwise the type definition `resolved`
	* to by the `actual value` of the type [attribute] ...
	*/
	type = xmlSchemaGetType(ctxt->schema, elemDecl->namedType,
	    elemDecl->namedTypeNs);
	if (type == NULL) {
	    xmlSchemaPResCompAttrErr(ctxt,
		XML_SCHEMAP_SRC_RESOLVE,
		WXS_BASIC_CAST elemDecl, elemDecl->node,
		"type", elemDecl->namedType, elemDecl->namedTypeNs,
		XML_SCHEMA_TYPE_BASIC, "type definition");
	} else
	    elemDecl->subtypes = type;
    }
    if (elemDecl->substGroup != NULL) {
	xmlSchemaElementPtr substHead;

	/*
	* FIXME TODO: Do we need a new field in _xmlSchemaElement for
	* substitutionGroup?
	*/
	substHead = xmlSchemaGetElem(ctxt->schema, elemDecl->substGroup,
	    elemDecl->substGroupNs);
	if (substHead == NULL) {
	    xmlSchemaPResCompAttrErr(ctxt,
		XML_SCHEMAP_SRC_RESOLVE,
		WXS_BASIC_CAST elemDecl, NULL,
		"substitutionGroup", elemDecl->substGroup,
		elemDecl->substGroupNs, XML_SCHEMA_TYPE_ELEMENT, NULL);
	} else {
	    xmlSchemaResolveElementReferences(substHead, ctxt);
	    /*
	    * Set the "substitution group affiliation".
	    * NOTE that now we use the "refDecl" field for this.
	    */
	    WXS_SUBST_HEAD(elemDecl) = substHead;
	    /*
	    * The type definitions is set to:
	    * SPEC "...the {type definition} of the element
	    * declaration `resolved` to by the `actual value`
	    * of the substitutionGroup [attribute], if present"
	    */
	    if (elemDecl->subtypes == NULL) {
                if (substHead->subtypes == NULL) {
                    /*
                     * This can happen with self-referencing substitution
                     * groups. The cycle will be detected later, but we have
                     * to set subtypes to avoid null-pointer dereferences.
                     */
	            elemDecl->subtypes = xmlSchemaGetBuiltInType(
                            XML_SCHEMAS_ANYTYPE);
                } else {
		    elemDecl->subtypes = substHead->subtypes;
                }
            }
	}
    }
    /*
    * SPEC "The definition of anyType serves as the default type definition
    * for element declarations whose XML representation does not specify one."
    */
    if ((elemDecl->subtypes == NULL) &&
	(elemDecl->namedType == NULL) &&
	(elemDecl->substGroup == NULL))
	elemDecl->subtypes = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
}